

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

char * ImParseFormatTrimDecorations(char *fmt,char *buf,int buf_size)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *in_RCX;
  char *fmt_00;
  
  fmt_00 = fmt;
  do {
    cVar1 = *fmt_00;
    if (cVar1 == '\0') {
      iVar2 = 3;
      pcVar3 = in_RCX;
    }
    else if ((cVar1 != '%') || (iVar2 = 1, pcVar3 = fmt_00, fmt_00[1] == '%')) {
      fmt_00 = fmt_00 + (ulong)(cVar1 == '%') + 1;
      iVar2 = 0;
      pcVar3 = in_RCX;
    }
    in_RCX = pcVar3;
  } while (iVar2 == 0);
  if (iVar2 == 1) {
    fmt_00 = pcVar3;
  }
  if ((*fmt_00 == '%') && (pcVar3 = ImParseFormatFindEnd(fmt_00), fmt = fmt_00, *pcVar3 != '\0')) {
    iVar2 = ((int)pcVar3 - (int)fmt_00) + 1;
    if (buf_size <= iVar2) {
      iVar2 = buf_size;
    }
    fmt = buf;
    if (iVar2 != 0) {
      strncpy(buf,fmt_00,(long)iVar2);
      buf[(long)iVar2 - 1] = '\0';
    }
  }
  return fmt;
}

Assistant:

const char* ImParseFormatTrimDecorations(const char* fmt, char* buf, int buf_size)
{
    const char* fmt_start = ImParseFormatFindStart(fmt);
    if (fmt_start[0] != '%')
        return fmt;
    const char* fmt_end = ImParseFormatFindEnd(fmt_start);
    if (fmt_end[0] == 0) // If we only have leading decoration, we don't need to copy the data.
        return fmt_start;
    ImStrncpy(buf, fmt_start, ImMin((int)(fmt_end + 1 - fmt_start), buf_size));
    return buf;
}